

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O2

EStatusCode __thiscall OpenTypeFileInput::ReadOpenTypeSFNT(OpenTypeFileInput *this)

{
  OpenTypePrimitiveReader *this_00;
  EStatusCode EVar1;
  ulong uVar2;
  Trace *this_01;
  int i;
  uint uVar3;
  unsigned_long offsetTable;
  unsigned_long numFonts;
  unsigned_long sfntVersion;
  unsigned_long ttcVersion;
  
  this_00 = &this->mPrimitivesReader;
  OpenTypePrimitiveReader::SetOffset(this_00,this->mHeaderOffset);
  OpenTypePrimitiveReader::ReadULONG(this_00,&sfntVersion);
  EVar1 = OpenTypePrimitiveReader::GetInternalState(this_00);
  if (EVar1 != eSuccess) {
    return eFailure;
  }
  if (sfntVersion != 0x10000) {
    if (sfntVersion == 0x4f54544f) {
      this->mFontType = EOpenTypeCFF;
      return eSuccess;
    }
    if (sfntVersion != 0x74727565) {
      if (sfntVersion != 0x74746366) {
        EVar1 = ReadOpenTypeSFNTFromDfont(this);
        return -(uint)(EVar1 != eSuccess);
      }
      OpenTypePrimitiveReader::ReadULONG(this_00,&ttcVersion);
      OpenTypePrimitiveReader::ReadULONG(this_00,&numFonts);
      uVar2 = (ulong)this->mFaceIndex;
      if (numFonts <= uVar2) {
        this_01 = Trace::DefaultTrace();
        Trace::TraceToLog(this_01,
                          "OpenTypeFileInput::ReadOpenTypeSFNT, face index %d out of range. Max font count is %ld"
                          ,(ulong)this->mFaceIndex,numFonts);
        return eFailure;
      }
      for (uVar3 = 0; uVar3 <= (uint)uVar2; uVar3 = uVar3 + 1) {
        OpenTypePrimitiveReader::ReadULONG(this_00,&offsetTable);
        uVar2 = (ulong)this->mFaceIndex;
      }
      this->mHeaderOffset = this->mHeaderOffset + offsetTable;
      EVar1 = ReadOpenTypeSFNT(this);
      return EVar1;
    }
  }
  this->mFontType = EOpenTypeTrueType;
  return eSuccess;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadOpenTypeSFNT()
{
	unsigned long sfntVersion;

    mPrimitivesReader.SetOffset(mHeaderOffset);
	mPrimitivesReader.ReadULONG(sfntVersion);
    
    if(mPrimitivesReader.GetInternalState() != PDFHummus::eSuccess)
    {
        return PDFHummus::eFailure;
    }
    
    if((0x74746366 /* ttcf */ == sfntVersion))
    {
        // mgubi: a TrueType composite font, just get to the right face table 
        // for the format see http://www.microsoft.com/typography/otspec/otff.htm
        
        unsigned long ttcVersion;
        unsigned long numFonts;
        unsigned long offsetTable;
        
        mPrimitivesReader.ReadULONG(ttcVersion);
        mPrimitivesReader.ReadULONG(numFonts);
        
        if (mFaceIndex >= numFonts) 
        {
            TRACE_LOG2("OpenTypeFileInput::ReadOpenTypeSFNT, face index %d out of range. Max font count is %ld",mFaceIndex,numFonts);
            return PDFHummus::eFailure;
        }
        
        for (int i= 0; i<= mFaceIndex; ++i) {
            mPrimitivesReader.ReadULONG(offsetTable);
        }
        
        mHeaderOffset = mHeaderOffset + offsetTable;
        
        return ReadOpenTypeSFNT();
    } else if((0x10000 == sfntVersion) || (0x74727565 /* true */ == sfntVersion))
	{
		mFontType = EOpenTypeTrueType;
		return PDFHummus::eSuccess;
	}
	else if(0x4F54544F /* OTTO */ == sfntVersion)
	{
		mFontType = EOpenTypeCFF;
		return PDFHummus::eSuccess;
	}
	else if ((ReadOpenTypeSFNTFromDfont() == PDFHummus::eSuccess))
    {
		return PDFHummus::eSuccess;
    }
    else
		return PDFHummus::eFailure;
}